

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::NegativeTestQuoteMeta(string *unquoted,string *should_not_match,Options *options)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_2e0;
  StringPiece local_160 [2];
  StringPiece local_140;
  undefined1 local_130 [8];
  RE2 re;
  undefined1 local_40 [8];
  string quoted;
  Options *options_local;
  string *should_not_match_local;
  string *unquoted_local;
  
  StringPiece::StringPiece((StringPiece *)&re.named_groups_once_,unquoted);
  RE2::QuoteMeta_abi_cxx11_((RE2 *)local_40,(StringPiece *)&re.named_groups_once_);
  StringPiece::StringPiece(&local_140,(string *)local_40);
  RE2::RE2((RE2 *)local_130,&local_140,options);
  StringPiece::StringPiece(local_160,should_not_match);
  bVar1 = RE2::FullMatch<>(local_160,(RE2 *)local_130);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,399);
    poVar2 = LogMessage::stream(&local_2e0);
    poVar2 = std::operator<<(poVar2,"Check failed: !(RE2::FullMatch(should_not_match, re))");
    poVar2 = std::operator<<(poVar2,"Unquoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)unquoted);
    poVar2 = std::operator<<(poVar2,"\', quoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    std::operator<<(poVar2,"\'.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2e0);
  }
  RE2::~RE2((RE2 *)local_130);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void NegativeTestQuoteMeta(string unquoted, string should_not_match,
                                  const RE2::Options& options = RE2::DefaultOptions) {
  string quoted = RE2::QuoteMeta(unquoted);
  RE2 re(quoted, options);
  EXPECT_FALSE(RE2::FullMatch(should_not_match, re))
      << "Unquoted='" << unquoted << "', quoted='" << quoted << "'.";
}